

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitSIMDTernary(PrintExpressionContents *this,SIMDTernary *curr)

{
  SIMDTernary *curr_local;
  PrintExpressionContents *this_local;
  
  prepareColor(this->o);
  switch(curr->op) {
  case Bitselect:
    std::operator<<(this->o,"v128.bitselect");
    break;
  case RelaxedMaddVecF16x8:
    std::operator<<(this->o,"f16x8.relaxed_madd");
    break;
  case RelaxedNmaddVecF16x8:
    std::operator<<(this->o,"f16x8.relaxed_nmadd");
    break;
  case RelaxedMaddVecF32x4:
    std::operator<<(this->o,"f32x4.relaxed_madd");
    break;
  case RelaxedNmaddVecF32x4:
    std::operator<<(this->o,"f32x4.relaxed_nmadd");
    break;
  case RelaxedMaddVecF64x2:
    std::operator<<(this->o,"f64x2.relaxed_madd");
    break;
  case RelaxedNmaddVecF64x2:
    std::operator<<(this->o,"f64x2.relaxed_nmadd");
    break;
  case LaneselectI8x16:
    std::operator<<(this->o,"i8x16.laneselect");
    break;
  case LaneselectI16x8:
    std::operator<<(this->o,"i16x8.laneselect");
    break;
  case LaneselectI32x4:
    std::operator<<(this->o,"i32x4.laneselect");
    break;
  case LaneselectI64x2:
    std::operator<<(this->o,"i64x2.laneselect");
    break;
  case DotI8x16I7x16AddSToVecI32x4:
    std::operator<<(this->o,"i32x4.dot_i8x16_i7x16_add_s");
  }
  restoreNormalColor(this->o);
  return;
}

Assistant:

void visitSIMDTernary(SIMDTernary* curr) {
    prepareColor(o);
    switch (curr->op) {
      case Bitselect:
        o << "v128.bitselect";
        break;
      case LaneselectI8x16:
        o << "i8x16.laneselect";
        break;
      case LaneselectI16x8:
        o << "i16x8.laneselect";
        break;
      case LaneselectI32x4:
        o << "i32x4.laneselect";
        break;
      case LaneselectI64x2:
        o << "i64x2.laneselect";
        break;
      case RelaxedMaddVecF16x8:
        o << "f16x8.relaxed_madd";
        break;
      case RelaxedNmaddVecF16x8:
        o << "f16x8.relaxed_nmadd";
        break;
      case RelaxedMaddVecF32x4:
        o << "f32x4.relaxed_madd";
        break;
      case RelaxedNmaddVecF32x4:
        o << "f32x4.relaxed_nmadd";
        break;
      case RelaxedMaddVecF64x2:
        o << "f64x2.relaxed_madd";
        break;
      case RelaxedNmaddVecF64x2:
        o << "f64x2.relaxed_nmadd";
        break;
      case DotI8x16I7x16AddSToVecI32x4:
        o << "i32x4.dot_i8x16_i7x16_add_s";
        break;
    }
    restoreNormalColor(o);
  }